

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFormatUtil.hpp
# Opt level: O1

ostream * tcu::Format::operator<<(ostream *str,Array<void_*const_*> *fmt)

{
  void **ppvVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>(str,"{ ",2);
  ppvVar1 = fmt->begin;
  if (ppvVar1 != fmt->end) {
    do {
      if (ppvVar1 != fmt->begin) {
        std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
      }
      std::ostream::_M_insert<void_const*>(str);
      ppvVar1 = ppvVar1 + 1;
    } while (ppvVar1 != fmt->end);
  }
  std::__ostream_insert<char,std::char_traits<char>>(str," }",2);
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, const Array<Iterator>& fmt)
{
	str << "{ ";
	for (Iterator cur = fmt.begin; cur != fmt.end; ++cur)
	{
		if (cur != fmt.begin)
			str << ", ";
		str << *cur;
	}
	str << " }";
	return str;
}